

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O3

void transaction_tests::ReplaceRedeemScript(CScript *script,CScript *redeemScript)

{
  byte bVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pbVar4;
  pointer pvVar5;
  uint uVar6;
  undefined8 uVar7;
  const_iterator __begin1;
  pointer pvVar8;
  const_iterator __end1;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_78;
  allocator_type local_59;
  direct_or_indirect local_58;
  size_type sStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.indirect_contents.indirect = (char *)&PTR_CheckECDSASignature_0138d260;
  EvalScript(&local_78,script,2,(BaseSignatureChecker *)&local_58.indirect_contents,BASE,
             (ScriptError *)0x0);
  if (local_78.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("stack.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ,0x207,"void transaction_tests::ReplaceRedeemScript(CScript &, const CScript &)");
  }
  uVar6 = (redeemScript->super_CScriptBase)._size;
  if (0x1c < uVar6) {
    redeemScript = (CScript *)(redeemScript->super_CScriptBase)._union.indirect_contents.indirect;
    uVar6 = uVar6 - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58.indirect_contents,
             (const_iterator)redeemScript,(uchar *)((long)redeemScript + (long)(int)uVar6),&local_59
            );
  puVar2 = local_78.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = local_78.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_58.indirect_contents.indirect;
  local_78.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(local_58._12_4_,local_58.indirect_contents.capacity);
  local_78.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(local_58._20_4_,local_58._16_4_);
  local_58.indirect_contents.indirect = (char *)0x0;
  local_58.indirect_contents.capacity = 0;
  local_58._12_4_ = 0;
  local_58._16_4_ = 0;
  local_58._20_4_ = 0;
  if ((puVar2 != (pointer)0x0) &&
     (operator_delete(puVar2,(long)puVar3 - (long)puVar2),
     local_58.indirect_contents.indirect != (char *)0x0)) {
    operator_delete(local_58.indirect_contents.indirect,
                    CONCAT44(local_58._20_4_,local_58._16_4_) - local_58._0_8_);
  }
  pvVar5 = local_78.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58.indirect_contents.indirect = (char *)0x0;
  local_58.indirect_contents.capacity = 0;
  local_58._12_4_ = 0;
  local_58._16_4_ = 0;
  local_58._20_4_ = 0;
  local_58._24_4_ = 0;
  sStack_3c = 0;
  if (local_78.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar8 = local_78.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pbVar4 = (pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      b._M_extent._M_extent_value =
           (long)(pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)pbVar4;
      if (b._M_extent._M_extent_value == 1) {
        bVar1 = *pbVar4;
        if (bVar1 == 0) goto LAB_00671368;
        if (bVar1 < 0x11) {
          CScript::operator<<((CScript *)&local_58.indirect_contents,bVar1 + OP_RESERVED);
        }
        else {
          if (bVar1 != 0x81) goto LAB_00671368;
          uVar6 = sStack_3c - 0x1d;
          if (sStack_3c < 0x1d) {
            uVar6 = sStack_3c;
          }
          uVar7 = local_58.indirect_contents.indirect;
          if (sStack_3c < 0x1d) {
            uVar7 = &local_58;
          }
          local_59 = (allocator_type)0x4f;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents
                     ,(uchar *)((long)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar7)->
                                       indirect + (long)(int)uVar6),(uchar *)&local_59);
        }
      }
      else {
        if (b._M_extent._M_extent_value == 0) {
          uVar6 = sStack_3c - 0x1d;
          if (sStack_3c < 0x1d) {
            uVar6 = sStack_3c;
          }
          uVar7 = local_58.indirect_contents.indirect;
          if (sStack_3c < 0x1d) {
            uVar7 = &local_58;
          }
          local_59 = (allocator_type)0x0;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents
                     ,(uchar *)((long)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar7)->
                                       indirect + (long)(int)uVar6),(uchar *)&local_59);
          goto LAB_00671370;
        }
LAB_00671368:
        b._M_ptr = pbVar4;
        CScript::operator<<((CScript *)&local_58.indirect_contents,b);
      }
LAB_00671370:
      pvVar8 = pvVar8 + 1;
    } while (pvVar8 != pvVar5);
  }
  if (0x1c < (script->super_CScriptBase)._size) {
    free((script->super_CScriptBase)._union.indirect_contents.indirect);
  }
  *(ulong *)((long)&(script->super_CScriptBase)._union + 0xc) =
       CONCAT44(local_58._16_4_,local_58._12_4_);
  *(ulong *)((long)&(script->super_CScriptBase)._union + 0x14) =
       CONCAT44(local_58._24_4_,local_58._20_4_);
  (script->super_CScriptBase)._union.indirect_contents.indirect =
       local_58.indirect_contents.indirect;
  *(ulong *)((long)&(script->super_CScriptBase)._union + 8) =
       CONCAT44(local_58._12_4_,local_58.indirect_contents.capacity);
  (script->super_CScriptBase)._size = sStack_3c;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void ReplaceRedeemScript(CScript& script, const CScript& redeemScript)
{
    std::vector<valtype> stack;
    EvalScript(stack, script, SCRIPT_VERIFY_STRICTENC, BaseSignatureChecker(), SigVersion::BASE);
    assert(stack.size() > 0);
    stack.back() = std::vector<unsigned char>(redeemScript.begin(), redeemScript.end());
    script = PushAll(stack);
}